

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

void __thiscall rw::ColorQuant::makePalette(ColorQuant *this,int32 numColors,RGBA *colors)

{
  LinkList *this_00;
  uint uVar1;
  uint uVar2;
  LLLink *pLVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int32 iVar8;
  LLLink *pLVar9;
  long lVar10;
  
  this_00 = &this->leaves;
  while( true ) {
    iVar8 = LinkList::count(this_00);
    pLVar9 = (this_00->link).next;
    if (iVar8 <= numColors) break;
    reduceNode(this,(Node *)pLVar9[-9].prev);
  }
  lVar10 = 0;
  while (pLVar9 != &this_00->link) {
    pLVar3 = pLVar9->next;
    uVar1 = *(uint *)&pLVar9[-9].next;
    uVar2 = *(uint *)((long)&pLVar9[-10].next + 4);
    uVar4 = (ulong)*(uint *)&pLVar9[-10].next / (ulong)uVar1;
    *(int *)&pLVar9[-10].next = (int)uVar4;
    uVar5 = (ulong)uVar2 / (ulong)uVar1;
    *(int *)((long)&pLVar9[-10].next + 4) = (int)uVar5;
    uVar6 = (ulong)*(uint *)&pLVar9[-10].prev / (ulong)uVar1;
    *(int *)&pLVar9[-10].prev = (int)uVar6;
    uVar7 = (ulong)*(uint *)((long)&pLVar9[-10].prev + 4) / (ulong)uVar1;
    *(int *)((long)&pLVar9[-10].prev + 4) = (int)uVar7;
    colors[lVar10].red = (uint8)uVar4;
    colors[lVar10].green = (uint8)uVar5;
    colors[lVar10].blue = (uint8)uVar6;
    colors[lVar10].alpha = (uint8)uVar7;
    *(int *)&pLVar9[-9].next = (int)lVar10;
    lVar10 = lVar10 + 1;
    pLVar9 = pLVar3;
  }
  return;
}

Assistant:

void
ColorQuant::makePalette(int32 numColors, RGBA *colors)
{
	while(this->leaves.count() > numColors){
		Node *n = LLLinkGetData(this->leaves.link.next, Node, link);
		this->reduceNode(n->parent);
	}

	int i = 0;
	FORLIST(lnk, this->leaves){
		Node *n = LLLinkGetData(lnk, Node, link);
		n->r /= n->numPixels;
		n->g /= n->numPixels;
		n->b /= n->numPixels;
		n->a /= n->numPixels;
		colors[i].red = n->r;
		colors[i].green = n->g;
		colors[i].blue = n->b;
		colors[i].alpha = n->a;
		n->numPixels = i++;
	}
}